

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O3

int32_t __thiscall
icu_63::JapaneseCalendar::getDefaultMonthInYear(JapaneseCalendar *this,int32_t eyear)

{
  int iVar1;
  UErrorCode status;
  int32_t eraStart [3];
  UErrorCode local_2c;
  int local_28 [4];
  
  iVar1 = (*(this->super_GregorianCalendar).super_Calendar.super_UObject._vptr_UObject[0x32])();
  local_28[2] = 0;
  local_28[0] = 0;
  local_28[1] = 0;
  local_2c = U_ZERO_ERROR;
  EraRules::getStartDate(gJapaneseEraRules,iVar1,(int32_t (*) [3])local_28,&local_2c);
  iVar1 = local_28[1] + -1;
  if (local_28[0] != eyear) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int32_t JapaneseCalendar::getDefaultMonthInYear(int32_t eyear) 
{
    int32_t era = internalGetEra();
    // TODO do we assume we can trust 'era'?  What if it is denormalized?

    int32_t month = 0;

    // Find out if we are at the edge of an era
    int32_t eraStart[3] = { 0,0,0 };
    UErrorCode status = U_ZERO_ERROR;
    gJapaneseEraRules->getStartDate(era, eraStart, status);
    U_ASSERT(U_SUCCESS(status));
    if(eyear == eraStart[0]) {
        // Yes, we're in the first year of this era.
        return eraStart[1]  // month
                -1;         // return 0-based month
    }

    return month;
}